

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O1

void __thiscall Gluco::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  Queue<unsigned_int> *this_00;
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  vec<unsigned_int> *pvVar9;
  int local_34;
  
  if (this->n_touched != 0) {
    iVar4 = 0;
    local_34 = 0;
    iVar7 = (this->subsumption_queue).end;
    iVar2 = (this->subsumption_queue).first;
    iVar6 = iVar7 - iVar2;
    if (iVar7 < iVar2) {
      iVar4 = (this->subsumption_queue).buf.sz;
    }
    this_00 = &this->subsumption_queue;
    iVar7 = iVar6 + iVar4;
    if (iVar7 != 0 && SCARRY4(iVar6,iVar4) == iVar7 < 0) {
      do {
        puVar5 = Queue<unsigned_int>::operator[](this_00,local_34);
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= *puVar5)
        goto LAB_005be4f4;
        if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory[*puVar5] & 3) == 0)
        {
          puVar5 = Queue<unsigned_int>::operator[](this_00,local_34);
          uVar3 = *puVar5;
          if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar3)
          goto LAB_005be4f4;
          puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          *(ulong *)(puVar5 + uVar3) = *(ulong *)(puVar5 + uVar3) & 0xfffffffffffffffc | 2;
        }
        local_34 = local_34 + 1;
        iVar7 = (this->subsumption_queue).end;
        iVar4 = 0;
        iVar2 = (this->subsumption_queue).first;
        if (iVar7 < iVar2) {
          iVar4 = (this->subsumption_queue).buf.sz;
        }
      } while (local_34 < (iVar7 - iVar2) + iVar4);
    }
    local_34 = 0;
    if (0 < (this->touched).sz) {
      do {
        if ((this->touched).data[local_34] != '\0') {
          if ((this->occurs).dirty.data[local_34] != '\0') {
            OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
                      (&this->occurs,&local_34);
          }
          pvVar9 = (this->occurs).occs.data;
          if (0 < pvVar9[local_34].sz) {
            pvVar9 = pvVar9 + local_34;
            lVar8 = 0;
            do {
              uVar3 = pvVar9->data[lVar8];
              if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar3)
              goto LAB_005be4f4;
              if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory[uVar3] & 3) ==
                  0) {
                Queue<unsigned_int>::insert(this_00,uVar3);
                uVar3 = pvVar9->data[lVar8];
                if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar3)
                goto LAB_005be4f4;
                puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
                *(ulong *)(puVar5 + uVar3) = *(ulong *)(puVar5 + uVar3) & 0xfffffffffffffffc | 2;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < pvVar9->sz);
          }
          (this->touched).data[local_34] = '\0';
        }
        local_34 = local_34 + 1;
      } while (local_34 < (this->touched).sz);
    }
    iVar4 = 0;
    local_34 = 0;
    iVar7 = (this->subsumption_queue).end;
    iVar2 = (this->subsumption_queue).first;
    iVar6 = iVar7 - iVar2;
    if (iVar7 < iVar2) {
      iVar4 = (this->subsumption_queue).buf.sz;
    }
    iVar7 = iVar6 + iVar4;
    if (iVar7 != 0 && SCARRY4(iVar6,iVar4) == iVar7 < 0) {
      do {
        puVar5 = Queue<unsigned_int>::operator[](this_00,local_34);
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= *puVar5) {
LAB_005be4f4:
          __assert_fail("r >= 0 && r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                        ,0x42,
                        "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory[*puVar5] & 3) == 2)
        {
          puVar5 = Queue<unsigned_int>::operator[](this_00,local_34);
          if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= *puVar5)
          goto LAB_005be4f4;
          puVar1 = (ulong *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                            *puVar5);
          *puVar1 = *puVar1 & 0xfffffffffffffffc;
        }
        local_34 = local_34 + 1;
        iVar7 = (this->subsumption_queue).end;
        iVar4 = 0;
        iVar2 = (this->subsumption_queue).first;
        if (iVar7 < iVar2) {
          iVar4 = (this->subsumption_queue).buf.sz;
        }
      } while (local_34 < (iVar7 - iVar2) + iVar4);
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < touched.size(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}